

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

void __thiscall
slang::ast::ImmediateAssertionStatement::serializeTo
          (ImmediateAssertionStatement *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  ASTSerializer::write(serializer,4,"cond",(size_t)this->cond);
  if (this->ifTrue != (Statement *)0x0) {
    ASTSerializer::write(serializer,6,"ifTrue",(size_t)this->ifTrue);
  }
  if (this->ifFalse != (Statement *)0x0) {
    ASTSerializer::write(serializer,7,"ifFalse",(size_t)this->ifFalse);
  }
  sVar1 = ast::toString(this->assertionKind);
  ASTSerializer::write(serializer,0xd,"assertionKind",sVar1._M_len);
  ASTSerializer::write(serializer,10,"isDeferred",(ulong)this->isDeferred);
  ASTSerializer::write(serializer,7,"isFinal",(ulong)this->isFinal);
  return;
}

Assistant:

void ImmediateAssertionStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("cond", cond);
    if (ifTrue)
        serializer.write("ifTrue", *ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
    serializer.write("assertionKind", toString(assertionKind));
    serializer.write("isDeferred", isDeferred);
    serializer.write("isFinal", isFinal);
}